

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::removeSafeState(RBBITableBuilder *this,IntPair duplStates)

{
  int32_t iVar1;
  int32_t iVar2;
  UnicodeString *this_00;
  UChar local_40;
  int32_t newVal;
  int32_t existingVal;
  int32_t col;
  int32_t numCols;
  UnicodeString *sd;
  int32_t state;
  int32_t numStates;
  int32_t duplState;
  int32_t keepState;
  RBBITableBuilder *this_local;
  IntPair duplStates_local;
  
  this_local._4_4_ = duplStates.second;
  UVector::removeElementAt(this->fSafeTable,this_local._4_4_);
  iVar1 = UVector::size(this->fSafeTable);
  for (sd._0_4_ = 0; (int)sd < iVar1; sd._0_4_ = (int)sd + 1) {
    this_00 = (UnicodeString *)UVector::elementAt(this->fSafeTable,(int)sd);
    iVar2 = UnicodeString::length(this_00);
    for (newVal = 0; newVal < iVar2; newVal = newVal + 1) {
      local_40 = UnicodeString::charAt(this_00,newVal);
      if ((ushort)local_40 == this_local._4_4_) {
        local_40 = (UChar)duplStates.first;
      }
      else if ((int)this_local._4_4_ < (int)(uint)(ushort)local_40) {
        local_40 = local_40 + L'\xffff';
      }
      UnicodeString::setCharAt(this_00,newVal,local_40);
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::removeSafeState(IntPair duplStates) {
    const int32_t keepState = duplStates.first;
    const int32_t duplState = duplStates.second;
    U_ASSERT(keepState < duplState);
    U_ASSERT(duplState < fSafeTable->size());

    fSafeTable->removeElementAt(duplState);   // Note that fSafeTable has a deleter function
                                              // and will auto-delete the removed element.
    int32_t numStates = fSafeTable->size();
    for (int32_t state=0; state<numStates; ++state) {
        UnicodeString *sd = (UnicodeString *)fSafeTable->elementAt(state);
        int32_t numCols = sd->length();
        for (int32_t col=0; col<numCols; col++) {
            int32_t existingVal = sd->charAt(col);
            int32_t newVal = existingVal;
            if (existingVal == duplState) {
                newVal = keepState;
            } else if (existingVal > duplState) {
                newVal = existingVal - 1;
            }
            sd->setCharAt(col, static_cast<char16_t>(newVal));
        }
    }
}